

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void canvas_fixlinesfor(_glist *x,t_text *text)

{
  int iVar1;
  _outconnect *p_Var2;
  undefined4 extraout_var;
  _glist *p_Var3;
  t_linetraverser t;
  char tag [128];
  
  t.tr_ob = (t_object *)0x0;
  t.tr_nextoc = (_outconnect *)0x0;
  t.tr_nout = 0;
  t.tr_nextoutno = 0;
  t.tr_x = x;
  while( true ) {
    p_Var2 = linetraverser_next(&t);
    if (p_Var2 == (_outconnect *)0x0) break;
    if ((t.tr_ob == text) || (t.tr_ob2 == text)) {
      iVar1 = sprintf(tag,"l%lx",p_Var2);
      p_Var3 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
      pdgui_vmess((char *)0x0,"crs iiii",p_Var3,"coords",tag,(ulong)(uint)t.tr_lx1,
                  (ulong)(uint)t.tr_ly1,(ulong)(uint)t.tr_lx2,(ulong)(uint)t.tr_ly2);
    }
  }
  return;
}

Assistant:

void canvas_fixlinesfor(t_canvas *x, t_text *text)
{
    t_linetraverser t;
    t_outconnect *oc;

    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (t.tr_ob == text || t.tr_ob2 == text)
        {
            char tag[128];
            sprintf(tag, "l%lx", oc);
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(x), "coords", tag,
                t.tr_lx1,t.tr_ly1, t.tr_lx2,t.tr_ly2);
        }
    }
}